

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

UBool __thiscall icu_63::UnifiedCache::_isEvictable(UnifiedCache *this,UHashElement *element)

{
  SharedObject *this_00;
  UBool UVar1;
  
  this_00 = (SharedObject *)(element->value).pointer;
  if ((*(int *)((long)(element->key).pointer + 8) != 0) || (this->fNoValue != this_00)) {
    if (*(char *)((long)(element->key).pointer + 0xc) == '\0') {
      return '\x01';
    }
    if (this_00->softRefCount == 1) {
      UVar1 = SharedObject::noHardReferences(this_00);
      return UVar1 != '\0';
    }
  }
  return '\0';
}

Assistant:

UBool UnifiedCache::_isEvictable(const UHashElement *element) const
{
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    const SharedObject *theValue =
            (const SharedObject *) element->value.pointer;

    // Entries that are under construction are never evictable
    if (_inProgress(theValue, theKey->fCreationStatus)) {
        return FALSE;
    }

    // We can evict entries that are either not a master or have just
    // one reference (The one reference being from the cache itself).
    return (!theKey->fIsMaster || (theValue->softRefCount == 1 && theValue->noHardReferences()));
}